

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseExceptModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  pointer pEVar2;
  unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_> local_78;
  Enum local_70;
  Enum local_6c;
  undefined4 local_68;
  Enum local_54;
  Location local_50;
  unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_> local_30;
  unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_> field;
  Module *module_local;
  WastParser *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::ExceptionModuleField_*,_std::default_delete<wabt::ExceptionModuleField>_>
  .super__Head_base<0UL,_wabt::ExceptionModuleField_*,_false>._M_head_impl._4_4_ = Expect(this,Lpar)
  ;
  bVar1 = Failed(field._M_t.
                 super___uniq_ptr_impl<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::ExceptionModuleField_*,_std::default_delete<wabt::ExceptionModuleField>_>
                 .super__Head_base<0UL,_wabt::ExceptionModuleField_*,_false>._M_head_impl._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    GetLocation(&local_50,this);
    MakeUnique<wabt::ExceptionModuleField,wabt::Location>((wabt *)&local_30,&local_50);
    local_54 = (Enum)Expect(this,Except);
    bVar1 = Failed((Result)local_54);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      pEVar2 = std::
               unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>
               ::operator->(&local_30);
      ParseBindVarOpt(this,&(pEVar2->except).name);
      pEVar2 = std::
               unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>
               ::operator->(&local_30);
      local_6c = (Enum)ParseValueTypeList(this,&(pEVar2->except).sig);
      bVar1 = Failed((Result)local_6c);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        local_70 = (Enum)Expect(this,Rpar);
        bVar1 = Failed((Result)local_70);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          std::
          unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>::
          unique_ptr(&local_78,&local_30);
          Module::AppendField(module,&local_78);
          std::
          unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>::
          ~unique_ptr(&local_78);
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
      }
    }
    local_68 = 1;
    std::unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>::
    ~unique_ptr(&local_30);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseExceptModuleField(Module* module) {
  WABT_TRACE(ParseExceptModuleField);
  EXPECT(Lpar);
  auto field = MakeUnique<ExceptionModuleField>(GetLocation());
  EXPECT(Except);
  ParseBindVarOpt(&field->except.name);
  CHECK_RESULT(ParseValueTypeList(&field->except.sig));
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}